

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LangevinPiston.cpp
# Opt level: O2

void __thiscall OpenMD::LangevinPiston::evolveEtaB(LangevinPiston *this)

{
  this->prevEta = this->eta;
  genRandomForce(this,&this->randomForce_);
  this->eta = (this->randomForce_ / this->W_ +
              ((((this->super_NPT).instaPress - (this->super_NPT).targetPressure) *
               (this->super_NPT).instaVol) / (this->W_ * 163882576.0) - this->gamma_ * this->eta)) *
              (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2 + this->oldEta;
  return;
}

Assistant:

void LangevinPiston::evolveEtaB() {
    prevEta = eta;

    genRandomForce(randomForce_);

    eta = oldEta + dt2 * (instaVol * (instaPress - targetPressure) /
                              (Constants::pressureConvert * W_) -
                          gamma_ * eta + randomForce_ / W_);
  }